

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVLD2LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t extraout_RDX;
  uint64_t Address_02;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t uVar3;
  uint64_t Address_03;
  uint RegNo;
  uint RegNo_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  DecodeStatus local_3c;
  
  local_3c = MCDisassembler_Fail;
  switch(Insn >> 10 & 3) {
  case 0:
    uVar4 = Insn >> 5 & 7;
    uVar5 = Insn >> 3 & 2;
    iVar6 = 1;
    goto LAB_00150566;
  case 1:
    uVar4 = Insn >> 6 & 3;
    uVar5 = Insn >> 2 & 4;
    uVar1 = Insn & 0x20;
    break;
  case 2:
    if ((Insn & 0x20) != 0) {
      return MCDisassembler_Fail;
    }
    uVar4 = Insn >> 7 & 1;
    uVar5 = Insn >> 1 & 8;
    uVar1 = Insn & 0x40;
    break;
  case 3:
    goto switchD_001504fc_caseD_3;
  }
  iVar6 = 2 - (uint)(uVar1 == 0);
LAB_00150566:
  uVar1 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  local_3c = DecodeDPRRegisterClass(Inst,uVar1,Address,&switchD_001504fc::switchdataD_001c9ff0);
  Decoder_00 = (void *)(ulong)(local_3c | 2);
  if ((local_3c | 2) == MCDisassembler_Success) {
    DVar2 = DecodeDPRRegisterClass(Inst,iVar6 + uVar1,Address_00,Decoder_00);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_3c = MCDisassembler_SoftFail;
    }
    RegNo = Insn >> 0x10 & 0xf;
    RegNo_00 = Insn & 0xf;
    uVar3 = Address_01;
    if ((RegNo_00 != 0xf) &&
       (DVar2 = DecodeGPRRegisterClass(Inst,RegNo,Address_01,Decoder_00), uVar3 = extraout_RDX,
       DVar2 != MCDisassembler_Success)) {
      if (DVar2 != MCDisassembler_SoftFail) goto LAB_0015062f;
      local_3c = MCDisassembler_SoftFail;
    }
    DVar2 = DecodeGPRRegisterClass(Inst,RegNo,uVar3,Decoder_00);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_3c = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar5);
    uVar3 = Address_02;
    if (RegNo_00 != 0xf) {
      if (RegNo_00 == 0xd) {
        MCOperand_CreateReg0(Inst,0);
        uVar3 = extraout_RDX_00;
      }
      else {
        DVar2 = DecodeGPRRegisterClass(Inst,RegNo_00,Address_02,Decoder_00);
        uVar3 = extraout_RDX_01;
        if (DVar2 != MCDisassembler_Success) {
          if (DVar2 != MCDisassembler_SoftFail) {
            return MCDisassembler_Fail;
          }
          local_3c = MCDisassembler_SoftFail;
        }
      }
    }
    DVar2 = DecodeDPRRegisterClass(Inst,uVar1,uVar3,Decoder_00);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_3c = MCDisassembler_SoftFail;
    }
    DVar2 = DecodeDPRRegisterClass(Inst,iVar6 + uVar1,Address_03,Decoder_00);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_3c = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar4);
  }
  else {
LAB_0015062f:
    local_3c = MCDisassembler_Fail;
  }
switchD_001504fc_caseD_3:
  return local_3c;
}

Assistant:

static DecodeStatus DecodeVLD2LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			index = fieldFromInstruction_4(Insn, 5, 3);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 2;
			break;
		case 1:
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 4;
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 5, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 4, 1) != 0)
				align = 8;
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}